

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

string * __thiscall
cmsys::SystemInformationImplementation::ParseValueFromKStat_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,char *arguments)

{
  byte bVar1;
  pointer pbVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  SystemInformationImplementation *this_00;
  char cVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  pointer pbVar9;
  string buffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_string;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 local_88 [16];
  pointer local_78;
  value_type local_70;
  string *local_50;
  vector<const_char_*,_std::allocator<const_char_*>_> local_48;
  
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,arguments,(allocator<char> *)&local_c8);
  uVar3 = std::__cxx11::string::find((char)&local_70,0x20);
  if (uVar3 != 0xffffffffffffffff) {
    local_50 = __return_storage_ptr__;
    do {
      cVar7 = (char)&local_70;
      uVar4 = std::__cxx11::string::find(cVar7,0x22);
      uVar5 = std::__cxx11::string::find(cVar7,0x22);
      if (uVar4 < uVar5 && uVar5 != 0xffffffffffffffff) {
        do {
          if (uVar3 < uVar5 && uVar4 < uVar3) goto LAB_0052baf4;
          uVar4 = std::__cxx11::string::find(cVar7,0x22);
          uVar5 = std::__cxx11::string::find(cVar7,0x22);
        } while ((uVar5 != 0xffffffffffffffff) && (uVar4 < uVar5));
      }
      std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_70);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                 &local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      pbVar2 = local_a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      _Var6._M_current =
           local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
      local_c8._M_dataplus._M_p._0_1_ = 0x22;
      _Var6 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (_Var6,_Var6._M_current +
                               local_a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length,
                         (_Iter_equals_val<const_char>)&local_c8);
      pbVar2[-1]._M_string_length = (long)_Var6._M_current - (long)pbVar2[-1]._M_dataplus._M_p;
      *_Var6._M_current = '\0';
LAB_0052baf4:
      uVar3 = std::__cxx11::string::find(cVar7,0x20);
      __return_storage_ptr__ = local_50;
    } while (uVar3 != 0xffffffffffffffff);
  }
  std::__cxx11::string::erase((ulong)&local_70,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_a8,&local_70);
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_78 = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_88,
             ((long)local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 3);
  local_c8._M_dataplus._M_p = "kstat";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)local_88,(char **)&local_c8);
  local_c8._M_dataplus._M_p = "-p";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)local_88,(char **)&local_c8);
  pbVar2 = local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar9 = local_a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_c8._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)local_88,(char **)&local_c8);
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar2);
  }
  local_c8._M_dataplus._M_p = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)local_88,(char **)&local_c8);
  this_00 = (SystemInformationImplementation *)local_88;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_48,(vector<const_char_*,_std::allocator<const_char_*>_> *)this_00);
  RunProcess_abi_cxx11_(&local_c8,this_00,&local_48);
  if (local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar8 = local_c8._M_string_length;
LAB_0052bc31:
  while (sVar8 = sVar8 - 1, sVar8 != 0) {
    bVar1 = local_c8._M_dataplus._M_p[sVar8];
    if (0xc < bVar1) goto LAB_0052bc52;
    if (bVar1 != 10) {
      if (bVar1 != 9) goto LAB_0052bc5c;
      break;
    }
  }
LAB_0052bc70:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return __return_storage_ptr__;
LAB_0052bc52:
  if (bVar1 != 0xd) {
    if (bVar1 == 0x20) goto LAB_0052bc70;
LAB_0052bc5c:
    std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x01');
  }
  goto LAB_0052bc31;
}

Assistant:

std::string SystemInformationImplementation::ParseValueFromKStat(
  const char* arguments)
{
  std::vector<std::string> args_string;
  std::string command = arguments;
  size_t start = std::string::npos;
  size_t pos = command.find(' ', 0);
  while (pos != std::string::npos) {
    bool inQuotes = false;
    // Check if we are between quotes
    size_t b0 = command.find('"', 0);
    size_t b1 = command.find('"', b0 + 1);
    while (b0 != std::string::npos && b1 != std::string::npos && b1 > b0) {
      if (pos > b0 && pos < b1) {
        inQuotes = true;
        break;
      }
      b0 = command.find('"', b1 + 1);
      b1 = command.find('"', b0 + 1);
    }

    if (!inQuotes) {
      args_string.push_back(command.substr(start + 1, pos - start - 1));
      std::string& arg = args_string.back();

      // Remove the quotes if any
      arg.erase(std::remove(arg.begin(), arg.end(), '"'), arg.end());
      start = pos;
    }
    pos = command.find(' ', pos + 1);
  }
  command.erase(0, start + 1);
  args_string.push_back(command);

  std::vector<const char*> args;
  args.reserve(3 + args_string.size());
  args.push_back("kstat");
  args.push_back("-p");
  for (auto& i : args_string) {
    args.push_back(i.c_str());
  }
  args.push_back(nullptr);

  std::string buffer = this->RunProcess(args);

  std::string value;
  for (size_t i = buffer.size() - 1; i > 0; i--) {
    if (buffer[i] == ' ' || buffer[i] == '\t') {
      break;
    }
    if (buffer[i] != '\n' && buffer[i] != '\r') {
      value.insert(0u, 1, buffer[i]);
    }
  }
  return value;
}